

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# listener.c
# Opt level: O0

void nni_listener_rele(nni_listener *l)

{
  byte local_12;
  _Bool reap;
  nni_listener *l_local;
  
  nni_mtx_lock(&listeners_lk);
  if (l->l_ref < 1) {
    nni_panic("%s: %d: assert err: %s",
              "/workspace/llm4binary/github/license_c_cmakelists/nanomsg[P]nng/src/core/listener.c",
              0x165,"l->l_ref > 0");
  }
  l->l_ref = l->l_ref + -1;
  local_12 = 0;
  if (l->l_ref == 0) {
    local_12 = l->l_closed;
  }
  nni_mtx_unlock(&listeners_lk);
  if ((local_12 & 1) != 0) {
    nni_listener_reap(l);
  }
  return;
}

Assistant:

void
nni_listener_rele(nni_listener *l)
{
	bool reap;

	nni_mtx_lock(&listeners_lk);
	NNI_ASSERT(l->l_ref > 0);
	l->l_ref--;
	reap = ((l->l_ref == 0) && (l->l_closed));
	nni_mtx_unlock(&listeners_lk);
	if (reap) {
		nni_listener_reap(l);
	}
}